

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               ImGuiSliderFlags flags)

{
  bool bVar1;
  bool bVar2;
  float *pfVar3;
  uint in_ECX;
  undefined8 in_RDX;
  float *in_RSI;
  int in_EDI;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float in_XMM0_Da;
  float rhs;
  float fVar7;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float v_old_ref_for_accum_remainder;
  float v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  float tweak_factor;
  bool tweak_fast;
  bool tweak_slow;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float local_80;
  bool local_75;
  float local_5c;
  float local_58;
  float in_stack_ffffffffffffffb8;
  float fVar8;
  byte is_logarithmic_00;
  ImGuiContext *pIVar9;
  ImGuiDataType in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffe0;
  bool local_1;
  
  fVar7 = (float)(uint)((in_ECX & 0x100000) != 0);
  is_logarithmic_00 = in_XMM1_Da < in_XMM2_Da;
  bVar4 = (in_ECX & 0x20) != 0;
  bVar5 = in_EDI == 8;
  bVar6 = in_EDI == 9;
  local_75 = bVar5 || bVar6;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && ((bool)is_logarithmic_00)) &&
     (in_XMM2_Da - in_XMM1_Da < 3.4028235e+38)) {
    in_XMM0_Da = (in_XMM2_Da - in_XMM1_Da) * GImGui->DragSpeedDefaultRatio;
  }
  fVar8 = 0.0;
  pIVar9 = GImGui;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIVar9->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar3 = ImVec2::operator[](&(pIVar9->IO).MouseDelta,(long)(int)fVar7);
    fVar8 = *pfVar3;
    if (((pIVar9->IO).KeyAlt & 1U) != 0) {
      fVar8 = fVar8 * 0.01;
    }
    if (((pIVar9->IO).KeyShift & 1U) != 0) {
      fVar8 = fVar8 * 10.0;
    }
  }
  else if (pIVar9->ActiveIdSource == ImGuiInputSource_Nav) {
    if (bVar5 || bVar6) {
      fVar8 = (float)ImParseFormatPrecision
                               ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),(int)in_stack_ffffffffffffff74);
      in_stack_ffffffffffffff74 = in_XMM0_Da;
    }
    else {
      fVar8 = 0.0;
      in_stack_ffffffffffffff74 = in_XMM0_Da;
    }
    in_stack_ffffffffffffffb8 = fVar8;
    bVar1 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    bVar2 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    if (bVar1) {
      local_80 = 1.0;
    }
    else {
      in_stack_ffffffffffffff78 = 0x3f800000;
      in_stack_ffffffffffffff7c = 10.0;
      local_80 = in_stack_ffffffffffffff7c;
      if (!bVar2) {
        in_stack_ffffffffffffff7c = 1.0;
        local_80 = in_stack_ffffffffffffff7c;
      }
    }
    fVar8 = GetNavTweakPressedAmount((ImGuiAxis)fVar8);
    fVar8 = fVar8 * local_80;
    rhs = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff70);
    in_XMM0_Da = ImMax<float>(in_stack_ffffffffffffff74,rhs);
  }
  fVar8 = in_XMM0_Da * fVar8;
  if (fVar7 == 1.4013e-45) {
    fVar8 = -fVar8;
  }
  if (((bVar4) && (in_XMM2_Da - in_XMM1_Da < 3.4028235e+38)) && (1e-06 < in_XMM2_Da - in_XMM1_Da)) {
    fVar8 = fVar8 / (in_XMM2_Da - in_XMM1_Da);
  }
  bVar1 = false;
  if (((is_logarithmic_00 & 1) != 0) && ((*in_RSI < in_XMM2_Da || (bVar1 = true, fVar8 <= 0.0)))) {
    bVar1 = *in_RSI <= in_XMM1_Da && fVar8 < 0.0;
  }
  if (((pIVar9->ActiveIdIsJustActivated & 1U) != 0) || (bVar1)) {
    pIVar9->DragCurrentAccum = 0.0;
    pIVar9->DragCurrentAccumDirty = false;
  }
  else if ((fVar8 != 0.0) || (NAN(fVar8))) {
    pIVar9->DragCurrentAccum = fVar8 + pIVar9->DragCurrentAccum;
    pIVar9->DragCurrentAccumDirty = true;
  }
  if ((pIVar9->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_5c = 0.0;
    if (bVar4) {
      if (bVar5 || bVar6) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (int)in_stack_ffffffffffffff74);
      }
      ImPow(0.0,7.483618e-39);
      local_5c = ScaleRatioFromValueT<float,float,float>
                           (in_stack_ffffffffffffffd0,(float)((ulong)pIVar9 >> 0x20),SUB84(pIVar9,0)
                            ,fVar7,(bool)is_logarithmic_00,fVar8,in_stack_ffffffffffffffb8);
      local_58 = ScaleValueFromRatioT<float,float,float>
                           ((ImGuiDataType)in_RSI,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,
                            SUB41((uint)in_stack_ffffffffffffffe0 >> 0x18,0),
                            (float)((ulong)in_RDX >> 0x20),(float)in_RDX);
    }
    else {
      local_58 = pIVar9->DragCurrentAccum + *in_RSI;
    }
    if ((local_75) && ((in_ECX & 0x40) == 0)) {
      local_58 = RoundScalarWithFormatT<float>
                           ((char *)CONCAT44(in_XMM0_Da,in_XMM1_Da),(ImGuiDataType)in_XMM2_Da,
                            in_stack_ffffffffffffffe0);
    }
    pIVar9->DragCurrentAccumDirty = false;
    if (bVar4) {
      fVar7 = ScaleRatioFromValueT<float,float,float>
                        (in_stack_ffffffffffffffd0,(float)((ulong)pIVar9 >> 0x20),SUB84(pIVar9,0),
                         fVar7,(bool)is_logarithmic_00,fVar8,in_stack_ffffffffffffffb8);
      pIVar9->DragCurrentAccum = pIVar9->DragCurrentAccum - (fVar7 - local_5c);
    }
    else {
      pIVar9->DragCurrentAccum = pIVar9->DragCurrentAccum - (local_58 - *in_RSI);
    }
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_58 = 0.0;
    }
    if (((*in_RSI != local_58) || (NAN(*in_RSI) || NAN(local_58))) && ((is_logarithmic_00 & 1) != 0)
       ) {
      if ((local_58 < in_XMM1_Da) ||
         (((*in_RSI <= local_58 && local_58 != *in_RSI && (fVar8 < 0.0)) && (!bVar5 && !bVar6)))) {
        local_58 = in_XMM1_Da;
      }
      if ((in_XMM2_Da < local_58) || (((local_58 < *in_RSI && (0.0 < fVar8)) && (!bVar5 && !bVar6)))
         ) {
        local_58 = in_XMM2_Da;
      }
    }
    if ((*in_RSI != local_58) || (NAN(*in_RSI) || NAN(local_58))) {
      *in_RSI = local_58;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 1.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}